

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::renderDevLook(SceneRender *this,Uniforms *_uniforms)

{
  pointer ppMVar1;
  Model *pMVar2;
  size_t i;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppMVar1 = (this->m_devlook_spheres).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_devlook_spheres).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pMVar2 = ppMVar1[uVar3];
    if (pMVar2->m_model_vbo != (Vbo *)0x0) {
      vera::Shader::use(&pMVar2->mainShader);
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                (_uniforms,
                 &(this->m_devlook_spheres).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]->mainShader,1,1);
      vera::Model::render((this->m_devlook_spheres).
                          super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
    }
  }
  for (uVar3 = 0;
      ppMVar1 = (this->m_devlook_billboards).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_devlook_billboards).
                            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pMVar2 = ppMVar1[uVar3];
    if (pMVar2->m_model_vbo != (Vbo *)0x0) {
      vera::Shader::use(&pMVar2->mainShader);
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])
                (_uniforms,
                 &(this->m_devlook_billboards).
                  super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]->mainShader,1,1);
      vera::Model::render((this->m_devlook_billboards).
                          super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
    }
  }
  return;
}

Assistant:

void SceneRender::renderDevLook(Uniforms& _uniforms) {
    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        if (m_devlook_spheres[i]->getVbo() == nullptr)
            continue;

        m_devlook_spheres[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_spheres[i]->getShader() );
        m_devlook_spheres[i]->render();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        if (m_devlook_billboards[i]->getVbo() == nullptr)
            continue;

        m_devlook_billboards[i]->getShader()->use();
        _uniforms.feedTo( m_devlook_billboards[i]->getShader() );
        m_devlook_billboards[i]->render();
    }
}